

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyZipExtractFromBuf(SyArchive *pArch,char *zBuf,sxu32 nLen)

{
  SyArchiveEntry **ppSVar1;
  int *piVar2;
  ushort uVar3;
  SyArchiveEntry *pSVar4;
  sxi32 sVar5;
  sxu32 sVar6;
  sxu32 sVar7;
  SyArchiveEntry *pSrc;
  SyArchiveEntry **ppSVar8;
  SyArchiveEntry **ppSVar9;
  ushort uVar10;
  SyArchiveEntry *pSVar11;
  sxu32 *psVar12;
  long lVar13;
  char *pcVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  bool bVar19;
  SyString local_58;
  long local_48;
  ulong local_40;
  long local_38;
  
  if (nLen < 0x62) {
    return -0x18;
  }
  uVar15 = nLen - 0x16;
  uVar17 = 0x16;
  lVar13 = 0;
  while (((pcVar18 = zBuf + lVar13 + (ulong)uVar15, zBuf < pcVar18 && (uVar17 < 0x8015)) &&
         (sVar5 = SyMemcmp(pcVar18,"PK\x05\x06",4), sVar5 != 0))) {
    lVar13 = lVar13 + -1;
    uVar17 = uVar17 + 1;
  }
  if ((*(int *)(zBuf + lVar13 + (ulong)uVar15) == 0x6054b50) &&
     (*(undefined2 *)&pArch->nEntry = *(undefined2 *)(zBuf + lVar13 + (ulong)uVar15 + 8),
     pArch->nEntry < 0x8000)) {
    sVar7 = *(sxu32 *)(zBuf + lVar13 + (ulong)uVar15 + 0xc);
    pArch->nCentralSize = sVar7;
    if (-1 < (long)(int)sVar7) {
      uVar17 = *(uint *)(zBuf + lVar13 + (ulong)uVar15 + 0x10);
      pArch->nCentralOfft = uVar17;
      pcVar18 = pcVar18 + -(long)(int)sVar7;
      if ((pcVar18 <= zBuf) || (sVar5 = SyMemcmp(pcVar18,"PK\x01\x02",4), sVar5 != 0)) {
        if (nLen <= uVar17) {
          return -0x18;
        }
        pcVar18 = zBuf + uVar17;
        sVar5 = SyMemcmp(pcVar18,"PK\x01\x02",4);
        if (sVar5 != 0) {
          return -0x18;
        }
      }
      local_40 = (ulong)(uint)-(int)pcVar18;
      local_38 = (ulong)((nLen + (int)zBuf) - 0x16) + lVar13 + local_40;
      ppSVar1 = &pArch->pList;
      local_48 = (ulong)((nLen + (int)zBuf) - 0x44) + lVar13;
      uVar17 = 0;
      do {
        if (((uint)local_38 <= uVar17) ||
           (pSrc = (SyArchiveEntry *)SyMemBackendPoolAlloc(pArch->pAllocator,0xa8),
           pSrc == (SyArchiveEntry *)0x0)) goto LAB_00137721;
        SyZero(pSrc,0xa8);
        pSrc->nMagic = 0xdead635a;
        if ((*(int *)(pcVar18 + uVar17) == 0x2014b50) &&
           (*(undefined2 *)&(pSrc->sFileName).nByte =
                 *(undefined2 *)(pcVar18 + (ulong)uVar17 + 0x1c), (pSrc->sFileName).nByte < 0x8000))
        {
          pSrc->nExtra = *(sxu16 *)(pcVar18 + (ulong)uVar17 + 0x1e);
          uVar10 = *(ushort *)(pcVar18 + (ulong)uVar17 + 0x20);
          pSrc->nComprMeth = *(sxu16 *)(pcVar18 + (ulong)uVar17 + 10);
          SyDosTimeFormat(*(sxu32 *)(pcVar18 + (ulong)uVar17 + 0xc),&pSrc->sFmt);
          piVar2 = &(pSrc->sFmt).tm_mon;
          *piVar2 = *piVar2 + -1;
          pSrc->nCrc = *(sxu32 *)(pcVar18 + (ulong)uVar17 + 0x10);
          sVar7 = *(sxu32 *)(pcVar18 + (ulong)uVar17 + 0x18);
          pSrc->nByte = sVar7;
          if (((int)sVar7 < 0) ||
             (sVar7 = *(sxu32 *)(pcVar18 + (ulong)uVar17 + 0x14), pSrc->nByteCompr = sVar7,
             (int)sVar7 < 0)) goto LAB_001373f1;
          sVar7 = *(sxu32 *)(pcVar18 + (ulong)uVar17 + 0x2a);
          pSrc->nOfft = sVar7;
          bVar19 = -1 < (int)sVar7;
        }
        else {
          uVar10 = 0;
LAB_001373f1:
          bVar19 = false;
        }
        sVar7 = (pSrc->sFileName).nByte;
        uVar3 = pSrc->nExtra;
        iVar16 = sVar7 + uVar10 + (uint)uVar3 + 0x2e;
        if (!bVar19) goto LAB_0013743e;
        uVar15 = pSrc->nOfft;
        pcVar14 = zBuf + uVar15;
        sVar5 = SyMemcmp(pcVar14,"PK\x03\x04",4);
        if (sVar5 == 0) {
          pSrc->nOfft = *(ushort *)(pcVar14 + 0x1a) + uVar15 + (uint)*(ushort *)(pcVar14 + 0x1c) +
                        0x1e;
          pcVar14 = pcVar18 + (uVar17 + 0x2e);
          (pSrc->sFileName).zString = pcVar14;
          if ((sVar7 == 0) ||
             (((pSrc->nByte == 0 && (pcVar14[sVar7 - 1] != '/')) ||
              (pcVar14 = SyMemBackendStrDup(pArch->pAllocator,pcVar14,sVar7), pcVar14 == (char *)0x0
              )))) {
            SyMemBackendPoolFree(pArch->pAllocator,pSrc);
            uVar17 = iVar16 + uVar17;
          }
          else {
            (pSrc->sFileName).zString = pcVar14;
            sVar7 = (pSrc->sFileName).nByte;
            sVar6 = (*pArch->xHash)(pcVar14,sVar7);
            local_58.zString = pcVar14;
            local_58.nByte = sVar7;
            for (pSVar11 = pArch->apHash[pArch->nSize - 1 & sVar6]; pSVar11 != (SyArchiveEntry *)0x0
                ; pSVar11 = pSVar11->pNextHash) {
              if ((sVar6 == pSVar11->nHash) &&
                 (sVar5 = (*pArch->xCmp)(&local_58,&pSVar11->sFileName), sVar5 == 0)) {
                pSrc->pNextName = pSVar11->pNextName;
                pSVar11->pNextName = pSrc;
                psVar12 = &pSVar11->nDup;
                goto LAB_00137701;
              }
            }
            sVar7 = pArch->nSize;
            if (sVar7 * 3 < pArch->nLoaded) {
              ppSVar8 = (SyArchiveEntry **)SyMemBackendAlloc(pArch->pAllocator,sVar7 << 4);
              if (ppSVar8 != (SyArchiveEntry **)0x0) {
                SyZero(ppSVar8,sVar7 << 4);
                sVar6 = pArch->nLoaded;
                ppSVar9 = ppSVar1;
                while (bVar19 = sVar6 != 0, sVar6 = sVar6 - 1, bVar19) {
                  pSVar11 = *ppSVar9;
                  pSVar11->pNextHash = (SyArchiveEntry *)0x0;
                  pSVar11->pPrevHash = (SyArchiveEntry *)0x0;
                  uVar15 = pSVar11->nHash & sVar7 * 2 - 1;
                  pSVar4 = ppSVar8[uVar15];
                  pSVar11->pNextHash = pSVar4;
                  if (pSVar4 != (SyArchiveEntry *)0x0) {
                    pSVar4->pPrevHash = pSVar11;
                  }
                  ppSVar8[uVar15] = pSVar11;
                  ppSVar9 = &pSVar11->pNext;
                }
                SyMemBackendFree(pArch->pAllocator,pArch->apHash);
                pArch->apHash = ppSVar8;
                pArch->nSize = sVar7 * 2;
              }
            }
            sVar7 = (*pArch->xHash)((pSrc->sFileName).zString,(pSrc->sFileName).nByte);
            pSrc->nHash = sVar7;
            ppSVar8 = pArch->apHash;
            uVar15 = pArch->nSize - 1 & sVar7;
            pSVar11 = ppSVar8[uVar15];
            pSrc->pNextHash = pSVar11;
            if (pSVar11 != (SyArchiveEntry *)0x0) {
              pSVar11->pPrevHash = pSrc;
            }
            ppSVar8[uVar15] = pSrc;
            pSVar11 = *ppSVar1;
            if (pSVar11 != (SyArchiveEntry *)0x0) {
              pSrc->pNext = pSVar11;
              pSVar11->pPrev = pSrc;
            }
            *ppSVar1 = pSrc;
            psVar12 = &pArch->nLoaded;
LAB_00137701:
            *psVar12 = *psVar12 + 1;
            uVar17 = iVar16 + uVar17;
          }
        }
        else {
LAB_0013743e:
          local_58.zString = (char *)((ulong)local_58.zString & 0xffffffff00000000);
          SyMemBackendPoolFree(pArch->pAllocator,pSrc);
          sVar5 = SyBlobSearch(pcVar18 + (iVar16 + uVar17),
                               (((((int)local_40 - uVar17) - sVar7) - (uint)uVar10) - (uint)uVar3) +
                               (int)local_48,"PK\x01\x02",4,(sxu32 *)&local_58);
          uVar17 = iVar16 + uVar17 + (int)local_58.zString;
          if (sVar5 != 0) {
LAB_00137721:
            pArch->pCursor = pArch->pList;
            return (uint)(pArch->nLoaded != 0) * 3 + -3;
          }
        }
      } while( true );
    }
  }
  return -0x18;
}

Assistant:

JX9_PRIVATE sxi32 SyZipExtractFromBuf(SyArchive *pArch, const char *zBuf, sxu32 nLen)
 {
 	const unsigned char *zCentral, *zEnd;
 	sxi32 rc;
#if defined(UNTRUST)
 	if( SXARCH_INVALID(pArch) || zBuf == 0 ){
 		return SXERR_INVALID;
 	}
#endif 	
 	/* The miminal size of a zip archive:
 	 * LOCAL_HDR_SZ + CENTRAL_HDR_SZ + END_OF_CENTRAL_HDR_SZ
 	 * 		30				46				22
 	 */
 	 if( nLen < SXZIP_LOCAL_HDRSZ + SXZIP_CENTRAL_HDRSZ + SXZIP_END_CENTRAL_HDRSZ ){
 	 	return SXERR_CORRUPT; /* Don't bother processing return immediately */
 	 }
 	  		
 	zEnd = (unsigned char *)&zBuf[nLen - SXZIP_END_CENTRAL_HDRSZ];
 	/* Find the end of central directory */
 	while( ((sxu32)((unsigned char *)&zBuf[nLen] - zEnd) < (SXZIP_END_CENTRAL_HDRSZ + SXI16_HIGH)) &&
		zEnd > (unsigned char *)zBuf && SyMemcmp(zEnd, "PK\005\006", sizeof(sxu32)) != 0 ){
 		zEnd--;
 	} 	
 	/* Parse the end of central directory */
 	rc = ParseEndOfCentralDirectory(&(*pArch), zEnd);
 	if( rc != SXRET_OK ){
 		return rc;
 	} 	
 	
 	/* Find the starting offset of the central directory */
 	zCentral = &zEnd[-(sxi32)pArch->nCentralSize];
 	if( zCentral <= (unsigned char *)zBuf || SyMemcmp(zCentral, "PK\001\002", sizeof(sxu32)) != 0 ){
 		if( pArch->nCentralOfft >= nLen ){
			/* Corrupted central directory offset */
 			return SXERR_CORRUPT;
 		}
 		zCentral = (unsigned char *)&zBuf[pArch->nCentralOfft];
 		if( SyMemcmp(zCentral, "PK\001\002", sizeof(sxu32)) != 0 ){
 			/* Corrupted zip archive */
 			return SXERR_CORRUPT;
 		}
 		/* Fall thru and extract all valid entries from the central directory */
 	}
 	rc = ZipExtract(&(*pArch), zCentral, (sxu32)(zEnd - zCentral), (void *)zBuf);
 	return rc;
 }